

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

const_iterator __thiscall
r_code::list<r_exec::MDLController::REntry>::erase
          (list<r_exec::MDLController::REntry> *this,const_iterator *i)

{
  int64_t c;
  const_iterator *i_local;
  list<r_exec::MDLController::REntry> *this_local;
  
  c = _erase(this,(i->super__iterator)._cell);
  const_iterator::const_iterator((const_iterator *)&this_local,this,c);
  return _this_local;
}

Assistant:

const_iterator erase(const_iterator &i)
    {
        return const_iterator(this, _erase(i._cell)); // no check for i._cell==null.
    }